

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSDPResultData.c
# Opt level: O0

int SSDPResultData_assign(SSDPResultData *p,SSDPResultData *q)

{
  int iVar1;
  UpnpDiscovery *s;
  void *n;
  Upnp_FunPtr n_00;
  bool bVar2;
  undefined1 local_39;
  undefined4 local_1c;
  int ok;
  SSDPResultData *q_local;
  SSDPResultData *p_local;
  
  local_1c = 1;
  if (p != q) {
    s = SSDPResultData_get_Param(q);
    iVar1 = SSDPResultData_set_Param(p,s);
    bVar2 = false;
    if (iVar1 != 0) {
      n = SSDPResultData_get_Cookie(q);
      iVar1 = SSDPResultData_set_Cookie(p,n);
      bVar2 = iVar1 != 0;
    }
    local_39 = false;
    if (bVar2) {
      n_00 = SSDPResultData_get_CtrlptCallback(q);
      iVar1 = SSDPResultData_set_CtrlptCallback(p,n_00);
      local_39 = iVar1 != 0;
    }
    local_1c = (uint)local_39;
  }
  return local_1c;
}

Assistant:

int SSDPResultData_assign(SSDPResultData *p, const SSDPResultData *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok &&
		     SSDPResultData_set_Param(p, SSDPResultData_get_Param(q));
		ok = ok &&
		     SSDPResultData_set_Cookie(p, SSDPResultData_get_Cookie(q));
		ok = ok && SSDPResultData_set_CtrlptCallback(
				   p, SSDPResultData_get_CtrlptCallback(q));
	}

	return ok;
}